

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O2

void ImPlot::
     RenderPrimitives<ImPlot::StairsRenderer<ImPlot::GetterXsYs<double>,ImPlot::TransformerLinLin>>
               (StairsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLin> *renderer,
               ImDrawList *DrawList,ImRect *cull_rect)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int prim;
  bool bVar7;
  ImVec2 uv;
  
  uVar6 = renderer->Prims;
  uv = DrawList->_Data->TexUvWhitePixel;
  uVar4 = 0;
  prim = 0;
  do {
    if (uVar6 == 0) {
      if (uVar4 != 0) {
        ImDrawList::PrimUnreserve(DrawList,uVar4 * 0xc,uVar4 << 3);
      }
      return;
    }
    uVar1 = 0xffff - DrawList->_VtxCurrentIdx >> 3;
    uVar5 = uVar1;
    if (uVar6 < uVar1) {
      uVar5 = uVar6;
    }
    uVar2 = 0x40;
    if (uVar6 < 0x40) {
      uVar2 = uVar6;
    }
    if (uVar1 < uVar2) {
      if (uVar4 != 0) {
        ImDrawList::PrimUnreserve(DrawList,uVar4 * 0xc,uVar4 << 3);
      }
      uVar4 = 0x1fff;
      uVar5 = 0x1fff;
      if (uVar6 < 0x1fff) {
        uVar4 = uVar6;
        uVar5 = uVar6;
      }
LAB_0021cd92:
      ImDrawList::PrimReserve(DrawList,uVar4 * 0xc,uVar4 * 8);
      uVar1 = 0;
    }
    else {
      uVar1 = uVar4 - uVar5;
      if (uVar4 < uVar5) {
        uVar4 = uVar5 - uVar4;
        goto LAB_0021cd92;
      }
    }
    uVar4 = uVar1;
    iVar3 = uVar5 + prim;
    uVar1 = uVar5;
    while (bVar7 = uVar1 != 0, uVar1 = uVar1 - 1, bVar7) {
      bVar7 = StairsRenderer<ImPlot::GetterXsYs<double>,_ImPlot::TransformerLinLin>::operator()
                        (renderer,DrawList,cull_rect,&uv,prim);
      uVar4 = uVar4 + !bVar7;
      prim = prim + 1;
    }
    uVar6 = uVar6 - uVar5;
    prim = iVar3;
  } while( true );
}

Assistant:

inline void RenderPrimitives(const Renderer& renderer, ImDrawList& DrawList, const ImRect& cull_rect) {
    unsigned int prims        = renderer.Prims;
    unsigned int prims_culled = 0;
    unsigned int idx          = 0;
    const ImVec2 uv = DrawList._Data->TexUvWhitePixel;
    while (prims) {
        // find how many can be reserved up to end of current draw command's limit
        unsigned int cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - DrawList._VtxCurrentIdx) / Renderer::VtxConsumed);
        // make sure at least this many elements can be rendered to avoid situations where at the end of buffer this slow path is not taken all the time
        if (cnt >= ImMin(64u, prims)) {
            if (prims_culled >= cnt)
                prims_culled -= cnt; // reuse previous reservation
            else {
                DrawList.PrimReserve((cnt - prims_culled) * Renderer::IdxConsumed, (cnt - prims_culled) * Renderer::VtxConsumed); // add more elements to previous reservation
                prims_culled = 0;
            }
        }
        else
        {
            if (prims_culled > 0) {
                DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
                prims_culled = 0;
            }
            cnt = ImMin(prims, (MaxIdx<ImDrawIdx>::Value - 0/*DrawList._VtxCurrentIdx*/) / Renderer::VtxConsumed);
            DrawList.PrimReserve(cnt * Renderer::IdxConsumed, cnt * Renderer::VtxConsumed); // reserve new draw command
        }
        prims -= cnt;
        for (unsigned int ie = idx + cnt; idx != ie; ++idx) {
            if (!renderer(DrawList, cull_rect, uv, idx))
                prims_culled++;
        }
    }
    if (prims_culled > 0)
        DrawList.PrimUnreserve(prims_culled * Renderer::IdxConsumed, prims_culled * Renderer::VtxConsumed);
}